

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O3

void __thiscall
test::iu_FilePath_x_iutest_x_Normalize_Test::Body(iu_FilePath_x_iutest_x_Normalize_Test *this)

{
  iuFilePath *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  allocator<char> local_209;
  AssertionResult local_208;
  iuFilePath local_1e0;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  iutest::detail::iuFilePath::iuFilePath(&local_1e0,"path//to///dir////file.txt");
  iutest::internal::CmpHelperEQ<char[21],iutest::detail::iuFilePath>
            (&local_208,(internal *)"\"path/to/dir/file.txt\"","path","path/to/dir/file.txt",
             (char (*) [21])&local_1e0,in_R9);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_208.m_message._M_dataplus._M_p,&local_209);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0xe2;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_path._M_dataplus._M_p != &local_1e0.m_path.field_2) {
    operator_delete(local_1e0.m_path._M_dataplus._M_p,
                    local_1e0.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(FilePath, Normalize)
{
    ::iutest::internal::FilePath path("path//to///dir////file.txt");
#ifdef IUTEST_OS_WINDOWS
    IUTEST_EXPECT_EQ("path\\to\\dir\\file.txt", path);
#else
    IUTEST_EXPECT_EQ("path/to/dir/file.txt", path);
#endif
}